

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

bool __thiscall
QFileSystemModel::setData(QFileSystemModel *this,QModelIndex *idx,QVariant *value,int role)

{
  QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *this_00;
  QList<QString> *this_01;
  QFileSystemModelPrivate *this_02;
  QAbstractItemModel *pQVar1;
  QFileInfoGatherer *this_03;
  int *piVar2;
  _Head_base<0UL,_QFileSystemModelPrivate::QFileSystemNode_*,_false> _Var3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  qsizetype qVar7;
  QFileSystemNode *pQVar8;
  QFileSystemNode **ppQVar9;
  QFileSystemNode *pQVar10;
  pointer __p;
  long in_FS_OFFSET;
  bool bVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
  nodeToRename;
  QDir local_f8 [8];
  QFileInfo local_f0 [8];
  _Head_base<0UL,_QFileSystemModelPrivate::QFileSystemNode_*,_false> local_e8;
  QString local_e0;
  QString local_c8;
  QString local_a8;
  QString local_88;
  anon_union_24_3_e3d07ef4_for_data local_68;
  QString *pQStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar11 = false;
  if (((idx->r < 0) || (idx->c < 0)) || (bVar11 = false, (idx->m).ptr == (QAbstractItemModel *)0x0))
  goto LAB_00621285;
  if (role == 2 && idx->c == 0) {
    this_02 = *(QFileSystemModelPrivate **)&this->field_0x8;
    uVar6 = (**(code **)(*(long *)this + 0x138))(this,idx);
    if ((uVar6 & 2) != 0) {
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::toString();
      local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d.d._0_4_ = 0xaaaaaaaa;
      local_a8.d.d._4_4_ = 0xaaaaaaaa;
      local_a8.d.ptr._0_4_ = 0xaaaaaaaa;
      local_a8.d.ptr._4_4_ = 0xaaaaaaaa;
      pQVar1 = (idx->m).ptr;
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        local_68.shared = (PrivateShared *)0x0;
        local_68._8_8_ = (QString *)0x0;
        local_68._16_8_ = (QString *)0x0;
        pQStack_50 = (QString *)0x2;
      }
      else {
        (**(code **)(*(long *)pQVar1 + 0x90))(&local_68,pQVar1,idx,0);
      }
      ::QVariant::toString();
      ::QVariant::~QVariant((QVariant *)&local_68);
      if (local_88.d.size == local_a8.d.size) {
        QVar14.m_data._4_4_ = local_a8.d.ptr._4_4_;
        QVar14.m_data._0_4_ = local_a8.d.ptr._0_4_;
        QVar12.m_data = local_88.d.ptr;
        QVar12.m_size = local_88.d.size;
        QVar14.m_size = local_a8.d.size;
        cVar4 = QtPrivate::equalStrings(QVar12,QVar14);
        bVar11 = true;
        if (cVar4 == '\0') goto LAB_00621384;
      }
      else {
LAB_00621384:
        local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_c8.d.d._0_4_ = 0xaaaaaaaa;
        local_c8.d.d._4_4_ = 0xaaaaaaaa;
        local_c8.d.ptr._0_4_ = 0xaaaaaaaa;
        local_c8.d.ptr._4_4_ = 0xaaaaaaaa;
        (**(code **)(*(long *)this + 0x68))(&local_68,this,idx);
        filePath(&local_c8,this,(QModelIndex *)&local_68);
        if ((undefined1 *)local_88.d.size == (undefined1 *)0x0) {
          bVar11 = true;
        }
        else {
          QDir::toNativeSeparators(&local_e0);
          local_68.shared = (PrivateShared *)local_e0.d.size;
          local_68._8_8_ = local_e0.d.ptr;
          qVar7 = QStringView::indexOf((QStringView *)&local_68,(QChar)0x2f,0,CaseSensitive);
          bVar11 = qVar7 != -1;
          if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if (bVar11) {
LAB_00621631:
          bVar11 = false;
        }
        else {
          QDir::QDir((QDir *)local_68.data,&local_c8);
          cVar4 = QDir::rename((QString *)&local_68,&local_a8);
          QDir::~QDir((QDir *)local_68.data);
          if (cVar4 == '\0') goto LAB_00621631;
          pQVar10 = &this_02->root;
          if ((idx->m).ptr != (QAbstractItemModel *)0x0) {
            pQVar10 = (QFileSystemNode *)idx->i;
          }
          pQVar8 = &this_02->root;
          if (-1 < (idx->c | idx->r)) {
            pQVar8 = pQVar10;
          }
          pQVar10 = pQVar8->parent;
          this_00 = &pQVar10->children;
          pQVar8 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
                             (this_00,&pQVar8->fileName);
          this_01 = &pQVar10->visibleChildren;
          QVar13.m_data = (pQVar8->fileName).d.ptr;
          QVar13.m_size = (pQVar8->fileName).d.size;
          iVar5 = QtPrivate::QStringList_indexOf((QList_conflict *)this_01,QVar13,0,CaseSensitive);
          QList<QString>::removeAt(this_01,(long)iVar5);
          local_e8._M_head_impl = (QFileSystemNode *)&DAT_aaaaaaaaaaaaaaaa;
          local_e8._M_head_impl =
               QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::takeImpl<QString>
                         (this_00,&local_a8);
          QString::operator=(&(local_e8._M_head_impl)->fileName,&local_88);
          _Var3._M_head_impl = local_e8._M_head_impl;
          (local_e8._M_head_impl)->parent = pQVar10;
          this_03 = (this_02->fileInfoGatherer)._M_t.
                    super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>
                    .super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl;
          QDir::QDir(local_f8,&local_c8);
          QFileInfo::QFileInfo(local_f0,local_f8,&local_88);
          QFileInfoGatherer::getInfo
                    ((QExtendedInformation *)&local_68,(QFileInfoGatherer *)this_03,local_f0);
          QFileSystemModelPrivate::QFileSystemNode::populate
                    (_Var3._M_head_impl,(QExtendedInformation *)&local_68);
          QExtendedInformation::~QExtendedInformation((QExtendedInformation *)&local_68);
          QFileInfo::~QFileInfo(local_f0);
          QDir::~QDir(local_f8);
          _Var3._M_head_impl = local_e8._M_head_impl;
          (local_e8._M_head_impl)->isVisible = true;
          local_e8._M_head_impl = (QFileSystemNode *)0x0;
          ppQVar9 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::operator[]
                              (this_00,&local_88);
          *ppQVar9 = _Var3._M_head_impl;
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_01,(long)iVar5,&local_88);
          QList<QString>::begin(this_01);
          QFileSystemModelPrivate::delayedSort(this_02);
          local_68.shared = (PrivateShared *)0x0;
          local_68._8_8_ = &local_c8;
          local_68._16_8_ = &local_a8;
          pQStack_50 = &local_88;
          QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_68.shared);
          std::
          unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
          ::~unique_ptr((unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                         *)&local_e8);
          bVar11 = true;
        }
        piVar2 = (int *)CONCAT44(local_c8.d.d._4_4_,local_c8.d.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_c8.d.d._4_4_,local_c8.d.d._0_4_),2,0x10);
          }
        }
      }
      piVar2 = (int *)CONCAT44(local_a8.d.d._4_4_,local_a8.d.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_a8.d.d._4_4_,local_a8.d.d._0_4_),2,0x10);
        }
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_00621285;
    }
  }
  bVar11 = false;
LAB_00621285:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar11;
}

Assistant:

bool QFileSystemModel::setData(const QModelIndex &idx, const QVariant &value, int role)
{
    Q_D(QFileSystemModel);
    if (!idx.isValid()
        || idx.column() != 0
        || role != Qt::EditRole
        || (flags(idx) & Qt::ItemIsEditable) == 0) {
        return false;
    }

    QString newName = value.toString();
#ifdef Q_OS_WIN
    chopSpaceAndDot(newName);
    if (newName.isEmpty())
        return false;
#endif

    QString oldName = idx.data().toString();
    if (newName == oldName)
        return true;

    const QString parentPath = filePath(parent(idx));

    if (newName.isEmpty() || QDir::toNativeSeparators(newName).contains(QDir::separator()))
        return false;

#if QT_CONFIG(filesystemwatcher) && defined(Q_OS_WIN)
    // QTBUG-65683: Remove file system watchers prior to renaming to prevent
    // failure due to locked files on Windows.
    const QStringList watchedPaths = d->unwatchPathsAt(idx);
#endif // filesystemwatcher && Q_OS_WIN
    if (!QDir(parentPath).rename(oldName, newName)) {
#if QT_CONFIG(filesystemwatcher) && defined(Q_OS_WIN)
        d->watchPaths(watchedPaths);
#endif
        return false;
    } else {
        /*
            *After re-naming something we don't want the selection to change*
            - can't remove rows and later insert
            - can't quickly remove and insert
            - index pointer can't change because treeview doesn't use persistent index's

            - if this get any more complicated think of changing it to just
              use layoutChanged
         */

        QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(idx);
        QFileSystemModelPrivate::QFileSystemNode *parentNode = indexNode->parent;
        int visibleLocation = parentNode->visibleLocation(parentNode->children.value(indexNode->fileName)->fileName);

        parentNode->visibleChildren.removeAt(visibleLocation);
        std::unique_ptr<QFileSystemModelPrivate::QFileSystemNode> nodeToRename(parentNode->children.take(oldName));
        nodeToRename->fileName = newName;
        nodeToRename->parent = parentNode;
#if QT_CONFIG(filesystemwatcher)
        nodeToRename->populate(d->fileInfoGatherer->getInfo(QFileInfo(parentPath, newName)));
#endif
        nodeToRename->isVisible = true;
        parentNode->children[newName] = nodeToRename.release();
        parentNode->visibleChildren.insert(visibleLocation, newName);

        d->delayedSort();
        emit fileRenamed(parentPath, oldName, newName);
    }
    return true;
}